

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O0

bool duckdb::ApproxQuantileCoding::Decode<double,double>(double *source,double *target)

{
  bool bVar1;
  double *in_RSI;
  double *in_RDI;
  double dVar2;
  undefined1 local_1;
  
  bVar1 = duckdb::TryCast::Operation<double,double>(*in_RDI,in_RSI,false);
  if (bVar1) {
    local_1 = true;
  }
  else {
    if (0.0 < *in_RDI || *in_RDI == 0.0) {
      dVar2 = NumericLimits<double>::Maximum();
      *in_RSI = dVar2;
    }
    else {
      dVar2 = NumericLimits<double>::Minimum();
      *in_RSI = dVar2;
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool Decode(const SAVE_TYPE &source, TARGET_TYPE &target) {
		// The result is approximate, so clamp instead of overflowing.
		if (TryCast::Operation(source, target, false)) {
			return true;
		} else if (source < 0) {
			target = NumericLimits<TARGET_TYPE>::Minimum();
		} else {
			target = NumericLimits<TARGET_TYPE>::Maximum();
		}
		return false;
	}